

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_str_append_str_utf8(nk_str *str,char *text)

{
  int len;
  int iVar1;
  undefined8 in_RAX;
  nk_rune unicode;
  undefined8 uStack_28;
  
  uStack_28 = CONCAT71((int7)((ulong)in_RAX >> 8),str == (nk_str *)0x0);
  if (text != (char *)0x0 && str != (nk_str *)0x0) {
    len = nk_utf_decode(text,(nk_rune *)((long)&uStack_28 + 4),4);
    if (len != 0 && uStack_28._4_4_ != 0) {
      do {
        iVar1 = nk_utf_decode(text + len,(nk_rune *)((long)&uStack_28 + 4),4);
        len = len + iVar1;
        if (uStack_28._4_4_ == 0) break;
      } while (iVar1 != 0);
    }
    nk_str_append_text_char(str,text,len);
  }
  return 0;
}

Assistant:

NK_API int
nk_str_append_str_utf8(struct nk_str *str, const char *text)
{
    int runes = 0;
    int byte_len = 0;
    int num_runes = 0;
    int glyph_len = 0;
    nk_rune unicode;
    if (!str || !text) return 0;

    glyph_len = byte_len = nk_utf_decode(text+byte_len, &unicode, 4);
    while (unicode != '\0' && glyph_len) {
        glyph_len = nk_utf_decode(text+byte_len, &unicode, 4);
        byte_len += glyph_len;
        num_runes++;
    }
    nk_str_append_text_char(str, text, byte_len);
    return runes;
}